

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

void duckdb_je_sc_data_update_slab_size(sc_data_t *data,size_t begin,size_t end,int pgs)

{
  sc_t *sc_00;
  size_t reg_size_00;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t reg_size;
  sc_t *sc;
  int i;
  int local_20;
  
  local_20 = 0;
  while ((local_20 < *(int *)(in_RDI + 0xc) &&
         (sc_00 = (sc_t *)(in_RDI + 0x4c + (long)local_20 * 0x1c), (sc_00->bin & 1U) != 0))) {
    reg_size_00 = duckdb_je_reg_size_compute(sc_00->lg_base,sc_00->lg_delta,sc_00->ndelta);
    if ((in_RSI <= reg_size_00) && (reg_size_00 <= in_RDX)) {
      sc_data_update_sc_slab_size(sc_00,reg_size_00,(long)in_ECX);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void
sc_data_update_slab_size(sc_data_t *data, size_t begin, size_t end, int pgs) {
	assert(data->initialized);
	for (int i = 0; i < data->nsizes; i++) {
		sc_t *sc = &data->sc[i];
		if (!sc->bin) {
			break;
		}
		size_t reg_size = reg_size_compute(sc->lg_base, sc->lg_delta,
		    sc->ndelta);
		if (begin <= reg_size && reg_size <= end) {
			sc_data_update_sc_slab_size(sc, reg_size, pgs);
		}
	}
}